

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.h
# Opt level: O0

ostream * __thiscall
testinator::
stringifier_select<std::tuple<int>,_testinator::default_formatter,_testinator::detail::is_tuple_tag>
::output(stringifier_select<std::tuple<int>,_testinator::default_formatter,_testinator::detail::is_tuple_tag>
         *this,ostream *s)

{
  char *pcVar1;
  ostream *poVar2;
  anon_class_16_2_d7082ac2 f;
  ostream *s_local;
  stringifier_select<std::tuple<int>,_testinator::default_formatter,_testinator::detail::is_tuple_tag>
  *this_local;
  
  pcVar1 = default_formatter::opener<int>(this->m_f,this->m_t);
  ::std::operator<<((ostream *)s,pcVar1);
  f.this = (stringifier_select<std::tuple<int>,_testinator::default_formatter,_testinator::detail::is_tuple_tag>
            *)s;
  f.s = (ostream *)this;
  detail::
  for_each_in_tuple<testinator::stringifier_select<std::tuple<int>,testinator::default_formatter,testinator::detail::is_tuple_tag>::output(std::ostream&)const::_lambda(auto:1&&,unsigned_long)_1_,int>
            ((detail *)this->m_t,(tuple<int> *)s,f);
  pcVar1 = default_formatter::closer<int>(this->m_f,this->m_t);
  poVar2 = ::std::operator<<((ostream *)s,pcVar1);
  return (ostream *)poVar2;
}

Assistant:

std::ostream& output(std::ostream& s) const
  {
    s << m_f.opener(m_t);
    detail::for_each_in_tuple(m_t,
                              [&s, this] (auto&& e, size_t i)
                              { if (i > 0) s << m_f.separator(m_t);
                                s << prettyprint(std::forward<decltype(e)>(e)); });
    return s << m_f.closer(m_t);
  }